

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-hash.c
# Opt level: O0

void * Curl_uint_hash_get(uint_hash *h,uint id)

{
  uint_hash_entry **ppuVar1;
  uint uVar2;
  uint_hash_entry *local_28;
  uint_hash_entry *he;
  uint id_local;
  uint_hash *h_local;
  
  if (h->table != (uint_hash_entry **)0x0) {
    ppuVar1 = h->table;
    uVar2 = uint_hash_hash(id,h->slots);
    for (local_28 = ppuVar1[uVar2]; local_28 != (uint_hash_entry *)0x0; local_28 = local_28->next) {
      if (id == local_28->id) {
        return local_28->value;
      }
    }
  }
  return (void *)0x0;
}

Assistant:

void *Curl_uint_hash_get(struct uint_hash *h, unsigned int id)
{
  DEBUGASSERT(h);
  DEBUGASSERT(h->init == CURL_UINTHASHINIT);
  if(h->table) {
    struct uint_hash_entry *he;
    DEBUGASSERT(h->slots);
    he = CURL_UINT_HASH_SLOT(h, id);
    while(he) {
      if(id == he->id) {
        return he->value;
      }
      he = he->next;
    }
  }
  return NULL;
}